

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  double dVar5;
  int32_t k;
  lua_Number num;
  MSize len;
  GCstr *str;
  char *p;
  int narrow_local;
  cTValue *o_local;
  BCWriteCtx *ctx_local;
  char *local_28;
  byte *local_10;
  
  if ((uint)((int)(ctx->sb).e - (int)(ctx->sb).w) < 0xb) {
    local_10 = (byte *)lj_buf_more2(&ctx->sb,0xb);
  }
  else {
    local_10 = (byte *)(ctx->sb).w;
  }
  if ((int)(o->field_4).it >> 0xf == -5) {
    uVar3 = o->u64;
    uVar2 = *(uint *)((uVar3 & 0x7fffffffffff) + 0x14);
    if ((uint)((int)(ctx->sb).e - (int)(ctx->sb).w) < uVar2 + 5) {
      local_28 = lj_buf_more2(&ctx->sb,uVar2 + 5);
    }
    else {
      local_28 = (ctx->sb).w;
    }
    pcVar4 = lj_strfmt_wuleb128(local_28,uVar2 + 5);
    memcpy(pcVar4,(void *)((uVar3 & 0x7fffffffffff) + 0x18),(ulong)uVar2);
    str = (GCstr *)(pcVar4 + uVar2);
  }
  else if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff2) {
    if (narrow != 0) {
      dVar1 = o->n;
      dVar5 = (double)(int)dVar1;
      if ((dVar1 == dVar5) && (!NAN(dVar1) && !NAN(dVar5))) {
        *local_10 = 3;
        pcVar4 = lj_strfmt_wuleb128((char *)(local_10 + 1),(int)dVar1);
        (ctx->sb).w = pcVar4;
        return;
      }
    }
    *local_10 = 4;
    pcVar4 = lj_strfmt_wuleb128((char *)(local_10 + 1),(o->u32).lo);
    str = (GCstr *)lj_strfmt_wuleb128(pcVar4,(o->field_4).it);
  }
  else {
    str = (GCstr *)(local_10 + 1);
    *local_10 = (byte)((int)(o->field_4).it >> 0xf) ^ 0xff;
  }
  (ctx->sb).w = (char *)str;
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  char *p = lj_buf_more(&ctx->sb, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    p = lj_buf_more(&ctx->sb, 5+len);
    p = lj_strfmt_wuleb128(p, BCDUMP_KTAB_STR+len);
    p = lj_buf_wmem(p, strdata(str), len);
  } else if (tvisint(o)) {
    *p++ = BCDUMP_KTAB_INT;
    p = lj_strfmt_wuleb128(p, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	*p++ = BCDUMP_KTAB_INT;
	p = lj_strfmt_wuleb128(p, k);
	ctx->sb.w = p;
	return;
      }
    }
    *p++ = BCDUMP_KTAB_NUM;
    p = lj_strfmt_wuleb128(p, o->u32.lo);
    p = lj_strfmt_wuleb128(p, o->u32.hi);
  } else {
    lj_assertBCW(tvispri(o), "unhandled type %d", itype(o));
    *p++ = BCDUMP_KTAB_NIL+~itype(o);
  }
  ctx->sb.w = p;
}